

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

void sha256_Final(SHA256_CTX *context,sha2_byte *digest)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  uint uVar42;
  long lVar43;
  uint uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  if (digest != (sha2_byte *)0x0) {
    uVar44 = (uint)context->bitcount >> 3 & 0x3f;
    puVar1 = context->buffer;
    uVar42 = uVar44 + 1;
    *(undefined1 *)((long)context->buffer + (ulong)uVar44) = 0x80;
    if (0x37 < uVar44) {
      memzero((void *)((ulong)uVar42 + (long)puVar1),(ulong)(uVar44 ^ 0x3f));
      lVar43 = 10;
      do {
        auVar45 = *(undefined1 (*) [16])(context->state + lVar43);
        auVar47[1] = 0;
        auVar47[0] = auVar45[8];
        auVar47[2] = auVar45[9];
        auVar47[3] = 0;
        auVar47[4] = auVar45[10];
        auVar47[5] = 0;
        auVar47[6] = auVar45[0xb];
        auVar47[7] = 0;
        auVar47[8] = auVar45[0xc];
        auVar47[9] = 0;
        auVar47[10] = auVar45[0xd];
        auVar47[0xb] = 0;
        auVar47[0xc] = auVar45[0xe];
        auVar47[0xd] = 0;
        auVar47[0xe] = auVar45[0xf];
        auVar47[0xf] = 0;
        auVar47 = pshuflw(auVar47,auVar47,0x1b);
        auVar47 = pshufhw(auVar47,auVar47,0x1b);
        auVar19[0xd] = 0;
        auVar19._0_13_ = auVar45._0_13_;
        auVar19[0xe] = auVar45[7];
        auVar21[0xc] = auVar45[6];
        auVar21._0_12_ = auVar45._0_12_;
        auVar21._13_2_ = auVar19._13_2_;
        auVar23[0xb] = 0;
        auVar23._0_11_ = auVar45._0_11_;
        auVar23._12_3_ = auVar21._12_3_;
        auVar25[10] = auVar45[5];
        auVar25._0_10_ = auVar45._0_10_;
        auVar25._11_4_ = auVar23._11_4_;
        auVar27[9] = 0;
        auVar27._0_9_ = auVar45._0_9_;
        auVar27._10_5_ = auVar25._10_5_;
        auVar29[8] = auVar45[4];
        auVar29._0_8_ = auVar45._0_8_;
        auVar29._9_6_ = auVar27._9_6_;
        auVar36._7_8_ = 0;
        auVar36._0_7_ = auVar29._8_7_;
        auVar38._1_8_ = SUB158(auVar36 << 0x40,7);
        auVar38[0] = auVar45[3];
        auVar38._9_6_ = 0;
        auVar39._1_10_ = SUB1510(auVar38 << 0x30,5);
        auVar39[0] = auVar45[2];
        auVar39._11_4_ = 0;
        auVar31[2] = auVar45[1];
        auVar31._0_2_ = auVar45._0_2_;
        auVar31._3_12_ = SUB1512(auVar39 << 0x20,3);
        auVar45._0_2_ = auVar45._0_2_ & 0xff;
        auVar45._2_13_ = auVar31._2_13_;
        auVar45[0xf] = 0;
        auVar45 = pshuflw(auVar45,auVar45,0x1b);
        auVar45 = pshufhw(auVar45,auVar45,0x1b);
        sVar3 = auVar45._0_2_;
        sVar4 = auVar45._2_2_;
        sVar5 = auVar45._4_2_;
        sVar6 = auVar45._6_2_;
        sVar7 = auVar45._8_2_;
        sVar8 = auVar45._10_2_;
        sVar9 = auVar45._12_2_;
        sVar10 = auVar45._14_2_;
        sVar11 = auVar47._0_2_;
        sVar12 = auVar47._2_2_;
        sVar13 = auVar47._4_2_;
        sVar14 = auVar47._6_2_;
        sVar15 = auVar47._8_2_;
        sVar16 = auVar47._10_2_;
        sVar17 = auVar47._12_2_;
        sVar18 = auVar47._14_2_;
        puVar2 = context->state + lVar43;
        *(char *)puVar2 = (0 < sVar3) * (sVar3 < 0x100) * auVar45[0] - (0xff < sVar3);
        *(char *)((long)puVar2 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar45[2] - (0xff < sVar4);
        *(char *)((long)puVar2 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar45[4] - (0xff < sVar5);
        *(char *)((long)puVar2 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar45[6] - (0xff < sVar6);
        *(char *)(puVar2 + 1) = (0 < sVar7) * (sVar7 < 0x100) * auVar45[8] - (0xff < sVar7);
        *(char *)((long)puVar2 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar45[10] - (0xff < sVar8);
        *(char *)((long)puVar2 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar45[0xc] - (0xff < sVar9);
        *(char *)((long)puVar2 + 7) =
             (0 < sVar10) * (sVar10 < 0x100) * auVar45[0xe] - (0xff < sVar10);
        *(char *)(puVar2 + 2) = (0 < sVar11) * (sVar11 < 0x100) * auVar47[0] - (0xff < sVar11);
        *(char *)((long)puVar2 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar47[2] - (0xff < sVar12)
        ;
        *(char *)((long)puVar2 + 10) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar47[4] - (0xff < sVar13);
        *(char *)((long)puVar2 + 0xb) =
             (0 < sVar14) * (sVar14 < 0x100) * auVar47[6] - (0xff < sVar14);
        *(char *)(puVar2 + 3) = (0 < sVar15) * (sVar15 < 0x100) * auVar47[8] - (0xff < sVar15);
        *(char *)((long)puVar2 + 0xd) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar47[10] - (0xff < sVar16);
        *(char *)((long)puVar2 + 0xe) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar47[0xc] - (0xff < sVar17);
        *(char *)((long)puVar2 + 0xf) =
             (0 < sVar18) * (sVar18 < 0x100) * auVar47[0xe] - (0xff < sVar18);
        lVar43 = lVar43 + 4;
      } while (lVar43 != 0x1a);
      sha256_Transform(context->state,puVar1,context->state);
      uVar42 = 0;
    }
    memzero((void *)((ulong)uVar42 + (long)puVar1),(ulong)(0x38 - uVar42));
    lVar43 = 10;
    do {
      uVar42 = context->state[lVar43];
      context->state[lVar43] =
           uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8 | uVar42 << 0x18;
      lVar43 = lVar43 + 1;
    } while (lVar43 != 0x18);
    *(uint64_t *)(context->buffer + 0xe) = context->bitcount >> 0x20 | context->bitcount << 0x20;
    sha256_Transform(context->state,puVar1,context->state);
    lVar43 = 0;
    do {
      auVar45 = *(undefined1 (*) [16])(context->state + lVar43);
      auVar48[1] = 0;
      auVar48[0] = auVar45[8];
      auVar48[2] = auVar45[9];
      auVar48[3] = 0;
      auVar48[4] = auVar45[10];
      auVar48[5] = 0;
      auVar48[6] = auVar45[0xb];
      auVar48[7] = 0;
      auVar48[8] = auVar45[0xc];
      auVar48[9] = 0;
      auVar48[10] = auVar45[0xd];
      auVar48[0xb] = 0;
      auVar48[0xc] = auVar45[0xe];
      auVar48[0xd] = 0;
      auVar48[0xe] = auVar45[0xf];
      auVar48[0xf] = 0;
      auVar47 = pshuflw(auVar48,auVar48,0x1b);
      auVar47 = pshufhw(auVar47,auVar47,0x1b);
      auVar20[0xd] = 0;
      auVar20._0_13_ = auVar45._0_13_;
      auVar20[0xe] = auVar45[7];
      auVar22[0xc] = auVar45[6];
      auVar22._0_12_ = auVar45._0_12_;
      auVar22._13_2_ = auVar20._13_2_;
      auVar24[0xb] = 0;
      auVar24._0_11_ = auVar45._0_11_;
      auVar24._12_3_ = auVar22._12_3_;
      auVar26[10] = auVar45[5];
      auVar26._0_10_ = auVar45._0_10_;
      auVar26._11_4_ = auVar24._11_4_;
      auVar28[9] = 0;
      auVar28._0_9_ = auVar45._0_9_;
      auVar28._10_5_ = auVar26._10_5_;
      auVar30[8] = auVar45[4];
      auVar30._0_8_ = auVar45._0_8_;
      auVar30._9_6_ = auVar28._9_6_;
      auVar37._7_8_ = 0;
      auVar37._0_7_ = auVar30._8_7_;
      auVar40._1_8_ = SUB158(auVar37 << 0x40,7);
      auVar40[0] = auVar45[3];
      auVar40._9_6_ = 0;
      auVar41._1_10_ = SUB1510(auVar40 << 0x30,5);
      auVar41[0] = auVar45[2];
      auVar41._11_4_ = 0;
      auVar32[2] = auVar45[1];
      auVar32._0_2_ = auVar45._0_2_;
      auVar32._3_12_ = SUB1512(auVar41 << 0x20,3);
      auVar46._0_2_ = auVar45._0_2_ & 0xff;
      auVar46._2_13_ = auVar32._2_13_;
      auVar46[0xf] = 0;
      auVar45 = pshuflw(auVar46,auVar46,0x1b);
      auVar45 = pshufhw(auVar45,auVar45,0x1b);
      sVar3 = auVar45._0_2_;
      sVar4 = auVar45._2_2_;
      sVar5 = auVar45._4_2_;
      sVar6 = auVar45._6_2_;
      sVar7 = auVar45._8_2_;
      sVar8 = auVar45._10_2_;
      sVar9 = auVar45._12_2_;
      sVar10 = auVar45._14_2_;
      sVar11 = auVar47._0_2_;
      sVar12 = auVar47._2_2_;
      sVar13 = auVar47._4_2_;
      sVar14 = auVar47._6_2_;
      sVar15 = auVar47._8_2_;
      sVar16 = auVar47._10_2_;
      sVar17 = auVar47._12_2_;
      sVar18 = auVar47._14_2_;
      puVar1 = context->state + lVar43;
      *(char *)puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar45[0] - (0xff < sVar3);
      *(char *)((long)puVar1 + 1) = (0 < sVar4) * (sVar4 < 0x100) * auVar45[2] - (0xff < sVar4);
      *(char *)((long)puVar1 + 2) = (0 < sVar5) * (sVar5 < 0x100) * auVar45[4] - (0xff < sVar5);
      *(char *)((long)puVar1 + 3) = (0 < sVar6) * (sVar6 < 0x100) * auVar45[6] - (0xff < sVar6);
      *(char *)(puVar1 + 1) = (0 < sVar7) * (sVar7 < 0x100) * auVar45[8] - (0xff < sVar7);
      *(char *)((long)puVar1 + 5) = (0 < sVar8) * (sVar8 < 0x100) * auVar45[10] - (0xff < sVar8);
      *(char *)((long)puVar1 + 6) = (0 < sVar9) * (sVar9 < 0x100) * auVar45[0xc] - (0xff < sVar9);
      *(char *)((long)puVar1 + 7) = (0 < sVar10) * (sVar10 < 0x100) * auVar45[0xe] - (0xff < sVar10)
      ;
      *(char *)(puVar1 + 2) = (0 < sVar11) * (sVar11 < 0x100) * auVar47[0] - (0xff < sVar11);
      *(char *)((long)puVar1 + 9) = (0 < sVar12) * (sVar12 < 0x100) * auVar47[2] - (0xff < sVar12);
      *(char *)((long)puVar1 + 10) = (0 < sVar13) * (sVar13 < 0x100) * auVar47[4] - (0xff < sVar13);
      *(char *)((long)puVar1 + 0xb) = (0 < sVar14) * (sVar14 < 0x100) * auVar47[6] - (0xff < sVar14)
      ;
      *(char *)(puVar1 + 3) = (0 < sVar15) * (sVar15 < 0x100) * auVar47[8] - (0xff < sVar15);
      *(char *)((long)puVar1 + 0xd) =
           (0 < sVar16) * (sVar16 < 0x100) * auVar47[10] - (0xff < sVar16);
      *(char *)((long)puVar1 + 0xe) =
           (0 < sVar17) * (sVar17 < 0x100) * auVar47[0xc] - (0xff < sVar17);
      *(char *)((long)puVar1 + 0xf) =
           (0 < sVar18) * (sVar18 < 0x100) * auVar47[0xe] - (0xff < sVar18);
      lVar43 = lVar43 + 4;
    } while (lVar43 != 8);
    uVar33 = *(undefined8 *)context->state;
    uVar34 = *(undefined8 *)(context->state + 2);
    uVar35 = *(undefined8 *)(context->state + 6);
    *(undefined8 *)(digest + 0x10) = *(undefined8 *)(context->state + 4);
    *(undefined8 *)(digest + 0x18) = uVar35;
    *(undefined8 *)digest = uVar33;
    *(undefined8 *)(digest + 8) = uVar34;
  }
  memzero(context,0x68);
  return;
}

Assistant:

void sha256_Final(trezor::SHA256_CTX* context, sha2_byte digest[]) {
	unsigned int	usedspace;

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		usedspace = (context->bitcount >> 3) % SHA256_BLOCK_LENGTH;
		/* Begin padding with a 1 bit: */
		((uint8_t*)context->buffer)[usedspace++] = 0x80;
		
		if (usedspace > SHA256_SHORT_BLOCK_LENGTH) {
			memzero(((uint8_t*)context->buffer) + usedspace, SHA256_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE32(context->buffer[j],context->buffer[j]);
			}
#endif
			/* Do second-to-last transform: */
			sha256_Transform(context->state, context->buffer, context->state);
			
			/* And prepare the last transform: */
			usedspace = 0;
		}
		/* Set-up for the last transform: */
		memzero(((uint8_t*)context->buffer) + usedspace, SHA256_SHORT_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 14; j++) {
			REVERSE32(context->buffer[j],context->buffer[j]);
		}
#endif
		/* Set the bit count: */
		context->buffer[14] = context->bitcount >> 32;
		context->buffer[15] = context->bitcount & 0xffffffff;

		/* Final transform: */
		sha256_Transform(context->state, context->buffer, context->state);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		for (int j = 0; j < 8; j++) {
			REVERSE32(context->state[j],context->state[j]);
		}
#endif
		MEMCPY_BCOPY(digest, context->state, SHA256_DIGEST_LENGTH);
	}

	/* Clean up state data: */
	memzero(context, sizeof(trezor::SHA256_CTX));
}